

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O3

void __thiscall APowerInvisibility::DoEffect(APowerInvisibility *this)

{
  int iVar1;
  AActor *pAVar2;
  FRenderStyle FVar3;
  double dVar4;
  double dVar5;
  
  APowerup::DoEffect(&this->super_APowerup);
  dVar4 = (double)((this->super_APowerup).super_AInventory.super_AActor.special1 + 1) *
          ((this->super_APowerup).Strength / 100.0);
  dVar5 = 1.0;
  if (dVar4 <= 1.0) {
    dVar5 = dVar4;
  }
  dVar5 = 1.0 - dVar5;
  dVar4 = 1.0;
  if (dVar5 <= 1.0) {
    dVar4 = dVar5;
  }
  pAVar2 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
  pAVar2->Alpha = (double)(-(ulong)(0.0 < dVar5) & (ulong)dVar4);
  iVar1 = (this->super_APowerup).Mode.super_FName.Index;
  switch(iVar1) {
  case 0x13:
    FVar3 = LegacyRenderStyles[7];
    break;
  case 0x15:
    FVar3 = LegacyRenderStyles[4];
    break;
  case 0x16:
    FVar3 = LegacyRenderStyles[1];
    break;
  case 0x17:
    FVar3 = LegacyRenderStyles[5];
    break;
  case 0x18:
    FVar3 = LegacyRenderStyles[0xc];
    break;
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
switchD_00606515_caseD_19:
    pAVar2->RenderStyle = LegacyRenderStyles[1];
    ((this->super_APowerup).super_AInventory.Owner.field_0.p)->Alpha = 1.0;
    return;
  case 0x1f:
    FVar3 = LegacyRenderStyles[9];
    break;
  default:
    if ((iVar1 != 0) && (iVar1 != 0x14d)) goto switchD_00606515_caseD_19;
  case 0x14:
    FVar3 = LegacyRenderStyles[6];
  }
  pAVar2->RenderStyle = FVar3;
  return;
}

Assistant:

void APowerInvisibility::DoEffect ()
{
	Super::DoEffect();
	// Due to potential interference with other PowerInvisibility items
	// the effect has to be refreshed each tic.
	double ts = (Strength / 100) * (special1 + 1);
	
	if (ts > 1.) ts = 1.;
	Owner->Alpha = clamp((1. - ts), 0., 1.);
	switch (Mode)
	{
	case (NAME_Fuzzy):
		Owner->RenderStyle = STYLE_OptFuzzy;
		break;
	case (NAME_Opaque):
		Owner->RenderStyle = STYLE_Normal;
		break;
	case (NAME_Additive):
		Owner->RenderStyle = STYLE_Add;
		break;
	case (NAME_Stencil):
		Owner->RenderStyle = STYLE_Stencil;
		break;
	case (NAME_AddStencil) :
		Owner->RenderStyle = STYLE_AddStencil;
		break;
	case (NAME_TranslucentStencil) :
		Owner->RenderStyle = STYLE_TranslucentStencil;
		break;
	case (NAME_None) :
	case (NAME_Cumulative):
	case (NAME_Translucent):
		Owner->RenderStyle = STYLE_Translucent;
		break;
	default: // Something's wrong
		Owner->RenderStyle = STYLE_Normal;
		Owner->Alpha = 1.;
		break;
	}
}